

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it
          )

{
  add_thousands_sep<wchar_t> thousands_sep;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> __result;
  wchar_t *__first;
  wchar_t *in_RCX;
  uint uStack_9c;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> local_78;
  __copy_move<false,false,std::random_access_iterator_tag> local_58 [64];
  
  __result = *it;
  thousands_sep.sep_.size_ = 1;
  thousands_sep.sep_.data_ = (wchar_t *)(this + 8);
  thousands_sep._16_8_ = (ulong)uStack_9c << 0x20;
  __first = internal::
            format_decimal<unsigned_int,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
                      ((wchar_t *)local_58,*(uint *)this,*(int *)(this + 4),thousands_sep);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<wchar_t*,fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>>
            (&local_78,local_58,__first,in_RCX,__result);
  *(ulong *)((long)&(it->super_truncating_iterator_base<wchar_t_*>).limit_ + 4) =
       CONCAT44((undefined4)local_78.super_truncating_iterator_base<wchar_t_*>.count_,
                local_78.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_);
  *(undefined8 *)((long)&(it->super_truncating_iterator_base<wchar_t_*>).count_ + 4) =
       local_78._20_8_;
  (it->super_truncating_iterator_base<wchar_t_*>).out_ =
       local_78.super_truncating_iterator_base<wchar_t_*>.out_;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ =
       CONCAT44(local_78.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_,
                (undefined4)local_78.super_truncating_iterator_base<wchar_t_*>.limit_);
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }